

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

void __thiscall
cs::domain_manager::add_var_no_return<char_const(&)[35]>
          (domain_manager *this,char (*name) [35],var *val)

{
  bool bVar1;
  domain_type *pdVar2;
  runtime_error *prVar3;
  allocator local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (*this->fiber_stack == (stack_type<cs::domain_type,_std::allocator> *)0x0) {
    pdVar2 = stack_type<cs::domain_type,_std::allocator>::top(&this->m_data);
    std::__cxx11::string::string((string *)&local_80,*name,(allocator *)&local_60);
    bVar1 = domain_type::add_var_optimal(pdVar2,&local_80,val,false);
    std::__cxx11::string::~string((string *)&local_80);
    if (!bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_40,*name,&local_81);
      std::operator+(&local_60,"Target domain exist variable \"",&local_40);
      std::operator+(&local_80,&local_60,"\".");
      runtime_error::runtime_error(prVar3,&local_80);
      __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  else {
    pdVar2 = stack_type<cs::domain_type,_std::allocator>::top(*this->fiber_stack);
    std::__cxx11::string::string((string *)&local_80,*name,(allocator *)&local_60);
    bVar1 = domain_type::add_var_optimal(pdVar2,&local_80,val,false);
    std::__cxx11::string::~string((string *)&local_80);
    if (!bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_40,*name,&local_81);
      std::operator+(&local_60,"Target domain exist variable \"",&local_40);
      std::operator+(&local_80,&local_60,"\".");
      runtime_error::runtime_error(prVar3,&local_80);
      __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void add_var_no_return(T &&name, const var &val)
		{
			if (fiber_stack != nullptr) {
				if (!fiber_stack->top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			else {
				if (!m_data.top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
		}